

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

ScriptFunction *
Js::ScriptFunction::OP_NewScFunc(FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  Type *addr;
  FunctionBody *this;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  undefined4 *puVar8;
  ScriptContext *pSVar9;
  ScriptFunctionWithInlineCache *this_00;
  char16 *pcVar10;
  undefined4 extraout_var;
  ScriptFunctionType *pSVar11;
  ScriptFunctionType *pSVar12;
  DynamicTypeHandler *pDVar13;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  if (infoRef == (FunctionInfoPtrPtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x3a,"(infoRef!= nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar3) goto LAB_00d5789c;
    *puVar8 = 0;
  }
  this = (FunctionBody *)(infoRef->ptr->functionBodyImpl).ptr;
  if (this == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x3c,"(functionProxy!= nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar3) goto LAB_00d5789c;
    *puVar8 = 0;
  }
  unique0x100004f0 = environment;
  pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  pTVar1 = pSVar9->threadContext;
  bVar3 = pTVar1->noJsReentrancy;
  pTVar1->noJsReentrancy = true;
  bVar4 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
  if (bVar4) {
    bVar4 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar4) goto LAB_00d5789c;
      *puVar8 = 0;
    }
    if ((this->field_0x17a & 8) != 0) {
      bVar4 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar4) goto LAB_00d5789c;
        *puVar8 = 0;
      }
      if ((*(uint *)&this->field_0x178 >> 0x12 & 1) == 0) {
        this_00 = JavascriptLibrary::CreateScriptFunctionWithInlineCache
                            ((pSVar9->super_ScriptContextBase).javascriptLibrary,
                             (FunctionProxy *)this);
        ScriptFunctionWithInlineCache::CreateInlineCache(this_00);
        uVar5 = FunctionBody::GetCountField(this,InlineCacheCount);
        uVar6 = FunctionBody::GetCountField(this,IsInstInlineCacheCount);
        if (uVar5 + uVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                      ,0x4e,
                                      "(functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount())"
                                      ,
                                      "functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount()"
                                     );
          if (!bVar4) {
LAB_00d5789c:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
        bVar4 = Phases::IsEnabled((Phases *)&DAT_015cd718,ScriptFunctionWithInlineCachePhase);
        if (bVar4) {
          pcVar10 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_98)
          ;
          iVar7 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
          Output::Print(L"Function object with inline cache: function number: (%s)\tfunction name: %s\n"
                        ,pcVar10,CONCAT44(extraout_var,iVar7));
          Output::Flush();
        }
        goto LAB_00d5781b;
      }
      *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffbffff;
    }
  }
  this_00 = (ScriptFunctionWithInlineCache *)0x0;
LAB_00d5781b:
  if (this_00 == (ScriptFunctionWithInlineCache *)0x0) {
    this_00 = (ScriptFunctionWithInlineCache *)
              JavascriptLibrary::CreateScriptFunction
                        ((pSVar9->super_ScriptContextBase).javascriptLibrary,(FunctionProxy *)this);
  }
  addr = &(this_00->super_ScriptFunction).environment;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = stack0xffffffffffffffc0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pSVar11 = FunctionProxy::GetUndeferredFunctionType((FunctionProxy *)this);
  if (pSVar11 != (ScriptFunctionType *)0x0) {
    pSVar11 = (ScriptFunctionType *)
              (this_00->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.
              super_DynamicObject.super_RecyclableObject.type.ptr;
    pSVar12 = FunctionProxy::GetDeferredPrototypeType((FunctionProxy *)this);
    if (pSVar11 == pSVar12) {
      pDVar13 = DynamicObject::GetTypeHandler((DynamicObject *)this_00);
      (*pDVar13->_vptr_DynamicTypeHandler[0x10])(pDVar13,this_00);
    }
  }
  pTVar1->noJsReentrancy = bVar3;
  return &this_00->super_ScriptFunction;
}

Assistant:

ScriptFunction * ScriptFunction::OP_NewScFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        AssertMsg(infoRef!= nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        AssertMsg(functionProxy!= nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
        ScriptContext* scriptContext = functionProxy->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScFunc, reentrancylock, scriptContext->GetThreadContext());

        ScriptFunction * pfuncScript = nullptr;
        if (functionProxy->IsFunctionBody() && functionProxy->GetFunctionBody()->GetInlineCachesOnFunctionObject())
        {
            FunctionBody * functionBody = functionProxy->GetFunctionBody();
            if (functionBody->GetIsFirstFunctionObject())
            {
                functionBody->SetIsNotFirstFunctionObject();
            }
            else
            {
                ScriptFunctionWithInlineCache* pfuncScriptWithInlineCache = scriptContext->GetLibrary()->CreateScriptFunctionWithInlineCache(functionProxy);
                // allocate inline cache for this function object
                pfuncScriptWithInlineCache->CreateInlineCache();

                Assert(functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount());
                if (PHASE_TRACE1(Js::ScriptFunctionWithInlineCachePhase))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("Function object with inline cache: function number: (%s)\tfunction name: %s\n"),
                        functionBody->GetDebugNumberSet(debugStringBuffer), functionBody->GetDisplayName());
                    Output::Flush();
                }

                pfuncScript = pfuncScriptWithInlineCache;
            }
        }

        if (pfuncScript == nullptr)
        {
            pfuncScript = scriptContext->GetLibrary()->CreateScriptFunction(functionProxy);
        }

        pfuncScript->SetEnvironment(environment);

        ScriptFunctionType *scFuncType = functionProxy->GetUndeferredFunctionType();
        if (scFuncType && pfuncScript->GetType() == functionProxy->GetDeferredPrototypeType())
        {
            pfuncScript->GetTypeHandler()->EnsureObjectReady(pfuncScript);
        }

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(pfuncScript, EtwTrace::GetFunctionId(functionProxy)));

        return pfuncScript;
        JIT_HELPER_END(ScrFunc_OP_NewScFunc);
    }